

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashlin.c
# Opt level: O0

void tommy_hashlin_stable(tommy_hashlin *hashlin)

{
  long lVar1;
  long in_FS_OFFSET;
  tommy_hashlin *hashlin_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hashlin->state = 0;
  hashlin->low_max = hashlin->bucket_max;
  hashlin->low_mask = hashlin->bucket_mask;
  hashlin->split = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

tommy_inline void tommy_hashlin_stable(tommy_hashlin* hashlin)
{
	hashlin->state = TOMMY_HASHLIN_STATE_STABLE;

	/* setup low_mask/max/split to allow tommy_hashlin_bucket_ref() */
	/* and tommy_hashlin_foreach() to work regardless we are in stable state */
	hashlin->low_max = hashlin->bucket_max;
	hashlin->low_mask = hashlin->bucket_mask;
	hashlin->split = 0;
}